

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O1

void __thiscall
JetHead::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
push_back(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  if (this->mSize == this->mAllocated) {
    sizeup(this,0);
  }
  pbVar2 = this->mData;
  uVar1 = this->mSize;
  pbVar4 = pbVar2 + uVar1;
  (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
  pcVar3 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pbVar2 + uVar1),pcVar3,pcVar3 + val->_M_string_length);
  this->mSize = this->mSize + 1;
  return;
}

Assistant:

void push_back(const T& val)
		{
			// If we've hit our limit, grow the array
			if (mSize == mAllocated)
			{
				sizeup();
			}
 
			// Now that we've got space, placement-new a copy of val
			new(mData + mSize) T(val);

			// And remember that we've stored another object
			mSize++;
		}